

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

MockSpec<int_(int)> * __thiscall
testing::internal::FunctionMocker<int_(int)>::With
          (MockSpec<int_(int)> *__return_storage_ptr__,FunctionMocker<int_(int)> *this,
          Matcher<int> *m)

{
  tuple<testing::Matcher<int>_> local_38;
  Matcher<int> *local_20;
  Matcher<int> *m_local;
  FunctionMocker<int_(int)> *this_local;
  
  local_20 = m;
  m_local = (Matcher<int> *)this;
  this_local = (FunctionMocker<int_(int)> *)__return_storage_ptr__;
  std::make_tuple<testing::Matcher<int>>(&local_38,m);
  MockSpec<int_(int)>::MockSpec(__return_storage_ptr__,this,&local_38);
  std::tuple<testing::Matcher<int>_>::~tuple(&local_38);
  return __return_storage_ptr__;
}

Assistant:

MockSpec<F> With(Matcher<Args>... m) {
    return MockSpec<F>(this, ::std::make_tuple(std::move(m)...));
  }